

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *headTarget;
  cmTarget *this_00;
  _Base_ptr p_Var3;
  _Base_ptr __n;
  cmMakefile *pcVar4;
  pointer puVar5;
  int iVar6;
  string *psVar7;
  cmValue cVar8;
  iterator iVar9;
  string *psVar10;
  cmFileSet *this_01;
  _Rb_tree_node_base *p_Var11;
  string *psVar12;
  pointer arch;
  _Base_ptr p_Var13;
  _Alloc_hider _Var14;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer pbVar15;
  pointer cge;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string pchOptions;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined8 local_308;
  char *local_300;
  size_type local_2f8;
  pointer local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  string file_set_type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string filterArch;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  cmGeneratorExpressionInterpreter genexInterpreter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pchSources._M_h._M_buckets = &pchSources._M_h._M_single_bucket;
  pchSources._M_h._M_bucket_count = 1;
  pchSources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pchSources._M_h._M_element_count = 0;
  pchSources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pchSources._M_h._M_rehash_policy._M_next_resize = 0;
  pchSources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cmGeneratorTarget::GetAppleArchs
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,&architectures);
  arch = architectures.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&architectures);
    arch = architectures.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar15 = architectures.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  filterArch._M_dataplus._M_p = (pointer)&filterArch.field_2;
  filterArch._M_string_length = 0;
  filterArch.field_2._M_local_buf[0] = '\0';
  if (arch != pbVar15) {
    do {
      cmGeneratorTarget::GetPchSource
                ((string *)&genexInterpreter,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 config,language,arch);
      psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      if (genexInterpreter.GeneratorExpression.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar7->_M_string_length) {
        if ((genexInterpreter.GeneratorExpression.Backtrace.
             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           (iVar6 = bcmp(genexInterpreter.GeneratorExpression.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(psVar7->_M_dataplus)._M_p,
                         (size_t)genexInterpreter.GeneratorExpression.Backtrace.
                                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                                 .
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi), iVar6 == 0)) {
          std::__cxx11::string::_M_assign((string *)&filterArch);
          goto LAB_003f92bb;
        }
LAB_003f92c0:
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pchOptions,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,arch);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&pchSources,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pchOptions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_p != &local_318) {
          operator_delete(local_328._M_p,local_318._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
          operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_003f92bb:
        if (genexInterpreter.GeneratorExpression.Backtrace.
            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_003f92c0;
      }
      if (genexInterpreter.GeneratorExpression.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)&genexInterpreter.CompiledGeneratorExpression) {
        operator_delete(genexInterpreter.GeneratorExpression.Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(long)genexInterpreter.CompiledGeneratorExpression._M_t.
                                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                      ._M_head_impl + 1);
      }
      arch = arch + 1;
    } while (arch != pbVar15);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,__return_storage_ptr__,source);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  cmCommonTargetGenerator::GetFlags
            (&pchOptions,&this->super_cmCommonTargetGenerator,language,config,&filterArch);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)pchOptions._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
    operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)language);
  if (iVar6 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source,NO);
  }
  pcVar1 = this->LocalGenerator;
  pcVar2 = (config->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,pcVar2 + config->_M_string_length);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = (language->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar2,pcVar2 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,(cmLocalGenerator *)pcVar1,&local_150,headTarget,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  COMPILE_FLAGS._M_dataplus._M_p = (pointer)&COMPILE_FLAGS.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&COMPILE_FLAGS,"COMPILE_FLAGS","");
  cVar8 = cmSourceFile::GetProperty(source,&COMPILE_FLAGS);
  if (cVar8.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
    psVar7 = cmGeneratorExpressionInterpreter::Evaluate(&genexInterpreter,&local_190,&COMPILE_FLAGS)
    ;
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,__return_storage_ptr__,psVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  COMPILE_OPTIONS._M_dataplus._M_p = (pointer)&COMPILE_OPTIONS.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS","");
  cVar8 = cmSourceFile::GetProperty(source,&COMPILE_OPTIONS);
  if (cVar8.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
    psVar7 = cmGeneratorExpressionInterpreter::Evaluate
                       (&genexInterpreter,&local_1b0,&COMPILE_OPTIONS);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar7,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (pchSources._M_h._M_element_count == 0) goto LAB_003f9852;
  pchOptions._M_dataplus._M_p = (pointer)&pchOptions.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&pchOptions,"SKIP_PRECOMPILE_HEADERS","");
  cVar8 = cmSourceFile::GetProperty(source,&pchOptions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
    operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
  }
  if (cVar8.Value != (string *)0x0) goto LAB_003f9852;
  pchOptions._M_dataplus._M_p = (pointer)&pchOptions.field_2;
  pchOptions._M_string_length = 0;
  pchOptions.field_2._M_allocated_capacity =
       pchOptions.field_2._M_allocated_capacity & 0xffffffffffffff00;
  psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&pchSources._M_h,psVar7);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    file_set_type._M_string_length = 0;
    file_set_type.field_2._M_local_buf[0] = '\0';
    file_set_type._M_dataplus._M_p = (pointer)&file_set_type.field_2;
    cmGeneratorTarget::GetPchUseCompileOptions
              ((string *)&files,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,&file_set_type);
    std::__cxx11::string::operator=((string *)&pchOptions,(string *)&files);
    if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
        &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)files._M_t._M_impl._0_8_,
                      (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_set_type._M_dataplus._M_p != &file_set_type.field_2) {
      p_Var13 = (_Base_ptr)
                CONCAT71(file_set_type.field_2._M_allocated_capacity._1_7_,
                         file_set_type.field_2._M_local_buf[0]);
      _Var14._M_p = file_set_type._M_dataplus._M_p;
      goto LAB_003f97b4;
    }
  }
  else {
    cmGeneratorTarget::GetPchCreateCompileOptions
              ((string *)&files,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,(string *)
                        ((long)iVar9.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur + 0x28));
    std::__cxx11::string::operator=((string *)&pchOptions,(string *)&files);
    p_Var13 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    _Var14._M_p = (pointer)files._M_t._M_impl._0_8_;
    if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
        &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_003f97b4:
      operator_delete(_Var14._M_p,(ulong)((long)&p_Var13->_M_color + 1));
    }
  }
  pcVar1 = this->LocalGenerator;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pchOptions._M_dataplus._M_p,
             pchOptions._M_dataplus._M_p + pchOptions._M_string_length);
  psVar7 = cmGeneratorExpressionInterpreter::Evaluate(&genexInterpreter,&local_1d0,&COMPILE_OPTIONS)
  ;
  cmLocalGenerator::AppendCompileOptions
            ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar7,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
    operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
  }
LAB_003f9852:
  psVar10 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  this_00 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  file_set_type._M_dataplus._M_p = (pointer)&file_set_type.field_2;
  file_set_type._M_string_length = 0;
  file_set_type.field_2._M_local_buf[0] = '\0';
  cmTarget::GetAllFileSetNames_abi_cxx11_(&local_118,this_00);
  psVar7 = local_118.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar7 == local_118.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)file_set_type._M_dataplus._M_p != &file_set_type.field_2) {
        operator_delete(file_set_type._M_dataplus._M_p,
                        CONCAT71(file_set_type.field_2._M_allocated_capacity._1_7_,
                                 file_set_type.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)COMPILE_OPTIONS._M_dataplus._M_p != &COMPILE_OPTIONS.field_2) {
        operator_delete(COMPILE_OPTIONS._M_dataplus._M_p,
                        COMPILE_OPTIONS.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)COMPILE_FLAGS._M_dataplus._M_p != &COMPILE_FLAGS.field_2) {
        operator_delete(COMPILE_FLAGS._M_dataplus._M_p,
                        COMPILE_FLAGS.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)genexInterpreter.Language._M_dataplus._M_p != &genexInterpreter.Language.field_2) {
        operator_delete(genexInterpreter.Language._M_dataplus._M_p,
                        genexInterpreter.Language.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)genexInterpreter.Config._M_dataplus._M_p != &genexInterpreter.Config.field_2) {
        operator_delete(genexInterpreter.Config._M_dataplus._M_p,
                        genexInterpreter.Config.field_2._M_allocated_capacity + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr(&genexInterpreter.CompiledGeneratorExpression);
      cmGeneratorExpression::~cmGeneratorExpression(&genexInterpreter.GeneratorExpression);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filterArch._M_dataplus._M_p != &filterArch.field_2) {
        operator_delete(filterArch._M_dataplus._M_p,
                        CONCAT71(filterArch.field_2._M_allocated_capacity._1_7_,
                                 filterArch.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&pchSources._M_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&architectures);
      return __return_storage_ptr__;
    }
    this_01 = cmTarget::GetFileSet(this_00,psVar7);
    if (this_01 == (cmFileSet *)0x0) {
      pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
      psVar12 = cmTarget::GetName_abi_cxx11_(this_00);
      pchOptions.field_2._8_8_ = (psVar12->_M_dataplus)._M_p;
      pchOptions.field_2._M_allocated_capacity = psVar12->_M_string_length;
      pchOptions._M_dataplus._M_p = (pointer)0x8;
      pchOptions._M_string_length = (long)"\nTarget \"" + 1;
      local_318._8_8_ = (psVar7->_M_dataplus)._M_p;
      local_318._M_allocated_capacity = psVar7->_M_string_length;
      local_308 = 0x18;
      local_300 = "\", but it was not found.";
      views._M_len = 5;
      views._M_array = (iterator)&pchOptions;
      cmCatViews_abi_cxx11_((string *)&files,views);
      cmMakefile::IssueMessage(pcVar4,INTERNAL_ERROR,(string *)&files);
      if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
          &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)files._M_t._M_impl._0_8_,
                        (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       )->_M_color + 1));
      }
    }
    else {
      cmFileSet::CompileFileEntries(&fileEntries,this_01);
      cmFileSet::CompileDirectoryEntries(&directoryEntries,this_01);
      cmFileSet::EvaluateDirectoryEntries
                (&directories,this_01,&directoryEntries,(cmLocalGenerator *)this->LocalGenerator,
                 config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar5 = fileEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &files._M_t._M_impl.super__Rb_tree_header._M_header;
      files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cge = fileEntries.
            super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (fileEntries.
          super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          fileEntries.
          super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmFileSet::EvaluateFileEntry
                    (this_01,&directories,&files,cge,(cmLocalGenerator *)this->LocalGenerator,config
                     ,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          cge = cge + 1;
        } while (cge != puVar5);
        p_Var11 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)files._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            &files._M_t._M_impl.super__Rb_tree_header) {
          do {
            p_Var13 = *(_Base_ptr *)(p_Var11 + 2);
            p_Var3 = p_Var11[2]._M_parent;
            if (p_Var13 != p_Var3) {
              pcVar2 = (psVar10->_M_dataplus)._M_p;
              __n = (_Base_ptr)psVar10->_M_string_length;
              do {
                if ((p_Var13->_M_parent == __n) &&
                   ((__n == (_Base_ptr)0x0 ||
                    (iVar6 = bcmp(*(void **)p_Var13,pcVar2,(size_t)__n), iVar6 == 0)))) {
                  std::__cxx11::string::_M_assign((string *)&file_set_type);
                  break;
                }
                p_Var13 = p_Var13 + 1;
              } while (p_Var13 != p_Var3);
            }
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != &files._M_t._M_impl.super__Rb_tree_header);
        }
      }
      if (file_set_type._M_string_length == 0x17) {
        auVar17[0] = -(*file_set_type._M_dataplus._M_p == 'C');
        auVar17[1] = -(file_set_type._M_dataplus._M_p[1] == 'X');
        auVar17[2] = -(file_set_type._M_dataplus._M_p[2] == 'X');
        auVar17[3] = -(file_set_type._M_dataplus._M_p[3] == '_');
        auVar17[4] = -(file_set_type._M_dataplus._M_p[4] == 'M');
        auVar17[5] = -(file_set_type._M_dataplus._M_p[5] == 'O');
        auVar17[6] = -(file_set_type._M_dataplus._M_p[6] == 'D');
        auVar17[7] = -(file_set_type._M_dataplus._M_p[7] == 'U');
        auVar17[8] = -(file_set_type._M_dataplus._M_p[8] == 'L');
        auVar17[9] = -(file_set_type._M_dataplus._M_p[9] == 'E');
        auVar17[10] = -(file_set_type._M_dataplus._M_p[10] == '_');
        auVar17[0xb] = -(file_set_type._M_dataplus._M_p[0xb] == 'H');
        auVar17[0xc] = -(file_set_type._M_dataplus._M_p[0xc] == 'E');
        auVar17[0xd] = -(file_set_type._M_dataplus._M_p[0xd] == 'A');
        auVar17[0xe] = -(file_set_type._M_dataplus._M_p[0xe] == 'D');
        auVar17[0xf] = -(file_set_type._M_dataplus._M_p[0xf] == 'E');
        auVar18[0] = -(file_set_type._M_dataplus._M_p[7] == 'U');
        auVar18[1] = -(file_set_type._M_dataplus._M_p[8] == 'L');
        auVar18[2] = -(file_set_type._M_dataplus._M_p[9] == 'E');
        auVar18[3] = -(file_set_type._M_dataplus._M_p[10] == '_');
        auVar18[4] = -(file_set_type._M_dataplus._M_p[0xb] == 'H');
        auVar18[5] = -(file_set_type._M_dataplus._M_p[0xc] == 'E');
        auVar18[6] = -(file_set_type._M_dataplus._M_p[0xd] == 'A');
        auVar18[7] = -(file_set_type._M_dataplus._M_p[0xe] == 'D');
        auVar18[8] = -(file_set_type._M_dataplus._M_p[0xf] == 'E');
        auVar18[9] = -(file_set_type._M_dataplus._M_p[0x10] == 'R');
        auVar18[10] = -(file_set_type._M_dataplus._M_p[0x11] == '_');
        auVar18[0xb] = -(file_set_type._M_dataplus._M_p[0x12] == 'U');
        auVar18[0xc] = -(file_set_type._M_dataplus._M_p[0x13] == 'N');
        auVar18[0xd] = -(file_set_type._M_dataplus._M_p[0x14] == 'I');
        auVar18[0xe] = -(file_set_type._M_dataplus._M_p[0x15] == 'T');
        auVar18[0xf] = -(file_set_type._M_dataplus._M_p[0x16] == 'S');
        auVar18 = auVar18 & auVar17;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) goto LAB_003f9bbf;
      }
      else if ((file_set_type._M_string_length == 0xb) &&
              (*(long *)(file_set_type._M_dataplus._M_p + 3) == 0x53454c55444f4d5f &&
               *(long *)file_set_type._M_dataplus._M_p == 0x55444f4d5f585843)) {
LAB_003f9bbf:
        cmSourceFile::GetLanguage_abi_cxx11_(&pchOptions,source);
        bVar16 = true;
        if (pchOptions._M_string_length == 3) {
          bVar16 = pchOptions._M_dataplus._M_p[2] != 'X' ||
                   *(short *)pchOptions._M_dataplus._M_p != 0x5843;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
          operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
        }
        if (bVar16) {
          pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
          psVar12 = cmTarget::GetName_abi_cxx11_(this_00);
          pchOptions.field_2._8_8_ = (psVar12->_M_dataplus)._M_p;
          pchOptions.field_2._M_allocated_capacity = psVar12->_M_string_length;
          pchOptions._M_dataplus._M_p = (pointer)0x8;
          pchOptions._M_string_length = (long)"\nTarget \"" + 1;
          local_318._8_8_ = (psVar10->_M_dataplus)._M_p;
          local_318._M_allocated_capacity = psVar10->_M_string_length;
          local_308 = 0x18;
          local_300 = "\nin a file set of type \"";
          local_2f8 = file_set_type._M_string_length;
          local_2f0 = file_set_type._M_dataplus._M_p;
          local_2e8 = 0x35;
          local_2e0 = "\" but the source is not classified as a \"CXX\" source.";
          views_00._M_len = 7;
          views_00._M_array = (iterator)&pchOptions;
          cmCatViews_abi_cxx11_(&local_1f0,views_00);
          cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&files._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directories);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&directoryEntries);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&fileEntries);
    }
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config)
{
  std::vector<std::string> architectures;
  std::unordered_map<std::string, std::string> pchSources;
  this->GeneratorTarget->GetAppleArchs(config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const& path = source->GetFullPath();
  auto const* tgt = this->GeneratorTarget->Target;

  std::string file_set_type;

  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, config, this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, config,
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        if (filename == path) {
          file_set_type = file_set->GetType();
          break;
        }
      }
    }

    if (file_set_type == "CXX_MODULES"_s ||
        file_set_type == "CXX_MODULE_HEADER_UNITS"_s) {
      if (source->GetLanguage() != "CXX"_s) {
        this->GetMakefile()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(
            "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
            "\nin a file set of type \"", file_set_type,
            R"(" but the source is not classified as a "CXX" source.)"));
        continue;
      }
    }
  }

  return flags;
}